

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
* detail::operator|(vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper<char32_t,_true,_false,_false> *info)

{
  size_type sVar1;
  size_type sVar2;
  unsigned_long uVar3;
  size_type local_78;
  unsigned_long local_50 [3];
  size_type local_38;
  size_t found;
  size_t current;
  split_helper<char32_t,_true,_false,_false> *local_20;
  split_helper<char32_t,_true,_false,_false> *info_local;
  b_str<char32_t> *str_local;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  *re;
  
  current._7_1_ = 0;
  local_20 = info;
  info_local = (split_helper<char32_t,_true,_false,_false> *)str;
  str_local = (b_str<char32_t> *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::vector(__return_storage_ptr__);
  found = 0;
  while (local_38 = std::__cxx11::
                    basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                    find_first_of((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                   *)info_local,local_20->delim,found),
        local_38 != 0xffffffffffffffff) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
            ::capacity(__return_storage_ptr__);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
            ::size(__return_storage_ptr__);
    if (sVar1 < sVar2 + 1) {
      uVar3 = std::numeric_limits<unsigned_long>::max();
      sVar1 = std::
              vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
              ::size(__return_storage_ptr__);
      if (uVar3 >> 1 < sVar1) {
        local_78 = std::numeric_limits<unsigned_long>::max();
      }
      else {
        sVar1 = std::
                vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                ::size(__return_storage_ptr__);
        local_78 = sVar1 << 1;
      }
      std::
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::reserve(__return_storage_ptr__,local_78);
    }
    local_50[0] = local_38 - found;
    std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
    emplace_back<std::__cxx11::u32string&,unsigned_long&,unsigned_long>
              ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
               __return_storage_ptr__,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               info_local,&found,local_50);
    found = local_38 + 1;
  }
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             info_local,0,found);
  std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
  emplace_back<std::__cxx11::u32string>
            ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
             __return_storage_ptr__,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             info_local);
  return __return_storage_ptr__;
}

Assistant:

vector<b_str<CharType>> operator| (b_str<CharType>&& str, const split_helper<CharType, true, false, false>& info)
	{
		vector<b_str<CharType>> re;
		size_t current = 0;
		for (size_t found; (found = str.find_first_of(info.delim, current)) != b_str<CharType>::npos; current = found + 1) {
			if (re.capacity() < re.size() + 1) re.reserve((std::numeric_limits<size_t>::max() / 2 < re.size()) ? std::numeric_limits<size_t>::max() : re.size() * 2);
			re.emplace_back(str, current, found - current);
		}
		str.erase(0, current);
		re.emplace_back(std::move(str));
		return re;
	}